

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<int> *sufdef)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  SuffixDef<int> *in_RDX;
  ArrayRef<int> *in_RDI;
  StringRef SVar4;
  ArrayRef<double> suf_dbl;
  ArrayRef<int> suf_int;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  ArrayRef<int> *in_stack_fffffffffffffec0;
  SuffixDef<int> *in_stack_fffffffffffffec8;
  SuffixDef<double> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar5;
  int iVar6;
  StringRef SVar7;
  BasicCStringRef<char> local_e0 [25];
  SuffixDef<int> *local_18;
  
  local_18 = in_RDX;
  ReadSuffix_OneTypeOnly<int>
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (SuffixDef<int> *)in_stack_fffffffffffffed0);
  bVar1 = ArrayRef::operator_cast_to_bool((ArrayRef<int> *)0x1a1c6d);
  if (bVar1) {
    ArrayRef<int>::ArrayRef
              (in_stack_fffffffffffffec0,
               (ArrayRef<int> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  else {
    SuffixDef<int>::to_type<double>(in_stack_fffffffffffffec8);
    ReadSuffix_OneTypeOnly<double>
              ((BasicProblem<mp::BasicProblemParams<int>_> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed0);
    SuffixDef<double>::~SuffixDef((SuffixDef<double> *)0x1a1cc1);
    bVar1 = ArrayRef::operator_cast_to_bool((ArrayRef<double> *)0x1a1cce);
    if (bVar1) {
      uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff08);
      uVar3 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                (local_e0,"Expected integer suffix .{}, kind {},\nbut fractional values provided");
      SVar4 = SuffixDef<int>::name(local_18);
      SVar7 = SVar4;
      iVar2 = SuffixDef<int>::kind(local_18);
      iVar6 = iVar2;
      fmt::format<fmt::BasicStringRef<char>,int>
                ((char *)SVar7.size_,(BasicStringRef<char> *)SVar7.data_,
                 (int *)CONCAT44(iVar2,uVar5));
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)SVar4.size_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffeb8));
      Error::Error((Error *)CONCAT44(iVar6,uVar5),(CStringRef)SVar7.data_,in_stack_ffffffffffffff04)
      ;
      __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
    }
    ArrayRef<int>::ArrayRef(in_stack_fffffffffffffec0);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x1a1e7b);
  }
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x1a1eb3);
  return in_RDI;
}

Assistant:

ArrayRef<int> ReadIntSuffix(const SuffixDef<int>& sufdef) {
    auto suf_int = ReadSuffix_OneTypeOnly(sufdef);
    if (!suf_int) {
      auto suf_dbl = ReadSuffix_OneTypeOnly(sufdef.to_type<double>());
      MP_ASSERT_ALWAYS(!suf_dbl,
                       fmt::format("Expected integer suffix .{}, kind {},\n"
                                   "but fractional values provided",
                                   sufdef.name(), sufdef.kind()));
      return {};
    }
    return suf_int;
  }